

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.pb.cc
# Opt level: O2

void __thiscall google::protobuf::ServiceDescriptorProto::Clear(ServiceDescriptorProto *this)

{
  byte bVar1;
  string *psVar2;
  uint uVar3;
  
  bVar1 = (byte)this->_has_bits_[0];
  uVar3 = (uint)bVar1;
  if (bVar1 != 0) {
    if (((bVar1 & 1) != 0) &&
       (psVar2 = this->name_, psVar2 != (string *)internal::kEmptyString_abi_cxx11_)) {
      psVar2->_M_string_length = 0;
      *(psVar2->_M_dataplus)._M_p = '\0';
      uVar3 = this->_has_bits_[0];
    }
    if (((uVar3 & 4) != 0) && (this->options_ != (ServiceOptions *)0x0)) {
      ServiceOptions::Clear(this->options_);
    }
  }
  internal::RepeatedPtrFieldBase::
  Clear<google::protobuf::RepeatedPtrField<google::protobuf::MethodDescriptorProto>::TypeHandler>
            (&(this->method_).super_RepeatedPtrFieldBase);
  this->_has_bits_[0] = 0;
  UnknownFieldSet::Clear(&this->_unknown_fields_);
  return;
}

Assistant:

void ServiceDescriptorProto::Clear() {
  if (_has_bits_[0 / 32] & (0xffu << (0 % 32))) {
    if (has_name()) {
      if (name_ != &::google::protobuf::internal::kEmptyString) {
        name_->clear();
      }
    }
    if (has_options()) {
      if (options_ != NULL) options_->::google::protobuf::ServiceOptions::Clear();
    }
  }
  method_.Clear();
  ::memset(_has_bits_, 0, sizeof(_has_bits_));
  mutable_unknown_fields()->Clear();
}